

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O2

int rtosc_arg_val_round(rtosc_arg_val_t *av)

{
  float fVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  
  cVar3 = av->type;
  iVar4 = 1;
  switch(cVar3) {
  case 'c':
  case 'h':
  case 'i':
    goto switchD_0010dfe2_caseD_63;
  case 'd':
    dVar2 = (av->val).d;
    (av->val).d = (double)(int)(((int)dVar2 + 1) - (uint)(dVar2 - (double)(int)dVar2 < 0.999));
    return iVar4;
  case 'e':
  case 'g':
    return 0;
  case 'f':
    fVar1 = (av->val).f;
    (av->val).f = (float)(int)(((int)fVar1 + 1) - (uint)(fVar1 - (float)(int)fVar1 < 0.999));
    return iVar4;
  default:
    if ((cVar3 != 'F') && (cVar3 != 'T')) {
      return 0;
    }
switchD_0010dfe2_caseD_63:
    return iVar4;
  }
}

Assistant:

int rtosc_arg_val_round(rtosc_arg_val_t* av)
{
    int tmp;
    switch(av->type)
    {
        case 'd':
            tmp = (int)(av->val.d);
            av->val.d = tmp + (int)(av->val.d - tmp >= 0.999);
            return true;
        case 'f':
            tmp = (int)(av->val.f);
            av->val.f = tmp + (int)(av->val.f - tmp >= 0.999f);
            return true;
        case 'h':
        case 'c':
        case 'i':
        case 'T':
        case 'F':
            return true;
        default:
            return false;
    }
}